

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::
SquareMatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Determinant>::
~SquareMatrixFuncCaseFactory
          (SquareMatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Determinant>
           *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

MovePtr<TestNode>	createCase		(const Context& ctx) const
	{
		TestCaseGroup*	group = new TestCaseGroup(ctx.testContext,
							  ctx.name.c_str(), ctx.name.c_str());
		group->addChild(createFuncCase(ctx, "mat2", instance<GenF<2> >()));
#if 0
		// disabled until we get reasonable results
		group->addChild(createFuncCase(ctx, "mat3", instance<GenF<3> >()));
		group->addChild(createFuncCase(ctx, "mat4", instance<GenF<4> >()));
#endif

		return MovePtr<TestNode>(group);
	}